

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_check.cpp
# Opt level: O2

bool CheckTransaction(CTransaction *tx,TxValidationState *state)

{
  uint uVar1;
  ulong uVar2;
  pointer pCVar3;
  bool bVar4;
  size_t sVar5;
  uint uVar6;
  pointer pCVar7;
  ulong uVar8;
  pointer pCVar9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<COutPoint>,_bool> pVar10;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> vInOutPoints;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vInOutPoints,"bad-txns-vin-empty",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
    bVar4 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                       (string *)&vInOutPoints,&local_58);
  }
  else if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vInOutPoints,"bad-txns-vout-empty",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
    bVar4 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                       (string *)&vInOutPoints,&local_58);
  }
  else {
    vInOutPoints._M_t._M_impl._0_8_ = &TX_NO_WITNESS;
    vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = tx;
    sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                      ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&vInOutPoints);
    if (sVar5 << 2 < 0x3d0901) {
      pCVar7 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if (pCVar7 == (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header;
          vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               vInOutPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          goto LAB_0062e390;
        }
        uVar2 = pCVar7->nValue;
        if ((long)uVar2 < 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vInOutPoints,"bad-txns-vout-negative",(allocator<char> *)&local_a8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
          bVar4 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                             (string *)&vInOutPoints,&local_58);
          goto LAB_0062e2a5;
        }
        if (2100000000000000 < uVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vInOutPoints,"bad-txns-vout-toolarge",(allocator<char> *)&local_a8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
          bVar4 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                             (string *)&vInOutPoints,&local_58);
          goto LAB_0062e2a5;
        }
        uVar8 = uVar8 + uVar2;
        pCVar7 = pCVar7 + 1;
      } while (uVar8 < 0x775f05a074001);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vInOutPoints,"bad-txns-txouttotal-toolarge",(allocator<char> *)&local_a8
                );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
      bVar4 = ValidationState<TxValidationResult>::Invalid
                        (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                         (string *)&vInOutPoints,&local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vInOutPoints,"bad-txns-oversize",(allocator<char> *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_a9);
      bVar4 = ValidationState<TxValidationResult>::Invalid
                        (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                         (string *)&vInOutPoints,&local_58);
    }
  }
LAB_0062e2a5:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&vInOutPoints);
  goto LAB_0062e2bb;
  while( true ) {
    pVar10 = std::
             _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
             ::_M_insert_unique<COutPoint_const&>
                       ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                         *)&vInOutPoints,&pCVar9->prevout);
    pCVar9 = pCVar9 + 1;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
LAB_0062e390:
    if (pCVar9 == pCVar3) {
      bVar4 = CTransaction::IsCoinBase(tx);
      pCVar9 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (!bVar4) {
        pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        goto LAB_0062e4f0;
      }
      uVar1 = (pCVar9->scriptSig).super_CScriptBase._size;
      uVar6 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar6 = uVar1;
      }
      bVar4 = true;
      if (0xffffff9c < uVar6 - 0x65) goto LAB_0062e55c;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"bad-cb-length",&local_a9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_aa);
      bVar4 = ValidationState<TxValidationResult>::Invalid
                        (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                         &local_a8);
      goto LAB_0062e546;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"bad-txns-inputs-duplicate",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_aa);
  bVar4 = ValidationState<TxValidationResult>::Invalid
                    (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                     &local_a8);
  goto LAB_0062e546;
  while( true ) {
    bVar4 = COutPoint::IsNull(&pCVar9->prevout);
    pCVar9 = pCVar9 + 1;
    if (bVar4) break;
LAB_0062e4f0:
    if (pCVar9 == pCVar3) {
      bVar4 = true;
      goto LAB_0062e55c;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"bad-txns-prevout-null",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_aa);
  bVar4 = ValidationState<TxValidationResult>::Invalid
                    (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                     &local_a8);
LAB_0062e546:
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_58);
LAB_0062e55c:
  std::
  _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
  ::~_Rb_tree(&vInOutPoints._M_t);
LAB_0062e2bb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckTransaction(const CTransaction& tx, TxValidationState& state)
{
    // Basic checks that don't depend on any context
    if (tx.vin.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vin-empty");
    if (tx.vout.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-empty");
    // Size limits (this doesn't take the witness into account, as that hasn't been checked for malleability)
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-oversize");
    }

    // Check for negative or overflow output values (see CVE-2010-5139)
    CAmount nValueOut = 0;
    for (const auto& txout : tx.vout)
    {
        if (txout.nValue < 0)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-negative");
        if (txout.nValue > MAX_MONEY)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-toolarge");
        nValueOut += txout.nValue;
        if (!MoneyRange(nValueOut))
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-txouttotal-toolarge");
    }

    // Check for duplicate inputs (see CVE-2018-17144)
    // While Consensus::CheckTxInputs does check if all inputs of a tx are available, and UpdateCoins marks all inputs
    // of a tx as spent, it does not check if the tx has duplicate inputs.
    // Failure to run this check will result in either a crash or an inflation bug, depending on the implementation of
    // the underlying coins database.
    std::set<COutPoint> vInOutPoints;
    for (const auto& txin : tx.vin) {
        if (!vInOutPoints.insert(txin.prevout).second)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputs-duplicate");
    }

    if (tx.IsCoinBase())
    {
        if (tx.vin[0].scriptSig.size() < 2 || tx.vin[0].scriptSig.size() > 100)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-cb-length");
    }
    else
    {
        for (const auto& txin : tx.vin)
            if (txin.prevout.IsNull())
                return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-prevout-null");
    }

    return true;
}